

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O0

void X509V3_EXT_val_prn(BIO *out,stack_st_CONF_VALUE *val,int indent,int ml)

{
  size_t sVar1;
  CONF_VALUE *pCVar2;
  CONF_VALUE *nval;
  size_t i;
  int ml_local;
  int indent_local;
  stack_st_CONF_VALUE *val_local;
  BIO *out_local;
  
  if (val != (stack_st_CONF_VALUE *)0x0) {
    if ((ml == 0) || (sVar1 = sk_CONF_VALUE_num((stack_st_CONF_VALUE *)val), sVar1 == 0)) {
      BIO_printf(out,"%*s",(ulong)(uint)indent,"");
      sVar1 = sk_CONF_VALUE_num((stack_st_CONF_VALUE *)val);
      if (sVar1 == 0) {
        BIO_puts(out,"<EMPTY>\n");
      }
    }
    for (nval = (CONF_VALUE *)0x0;
        pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num((stack_st_CONF_VALUE *)val), nval < pCVar2;
        nval = (CONF_VALUE *)((long)&nval->section + 1)) {
      if (ml == 0) {
        if (nval != (CONF_VALUE *)0x0) {
          BIO_printf(out,", ");
        }
      }
      else {
        BIO_printf(out,"%*s",(ulong)(uint)indent,"");
      }
      pCVar2 = sk_CONF_VALUE_value((stack_st_CONF_VALUE *)val,(size_t)nval);
      if (pCVar2->name == (char *)0x0) {
        BIO_puts(out,pCVar2->value);
      }
      else if (pCVar2->value == (char *)0x0) {
        BIO_puts(out,pCVar2->name);
      }
      else {
        BIO_printf(out,"%s:%s",pCVar2->name,pCVar2->value);
      }
      if (ml != 0) {
        BIO_puts(out,"\n");
      }
    }
  }
  return;
}

Assistant:

static void X509V3_EXT_val_prn(BIO *out, const STACK_OF(CONF_VALUE) *val,
                               int indent, int ml) {
  if (!val) {
    return;
  }
  if (!ml || !sk_CONF_VALUE_num(val)) {
    BIO_printf(out, "%*s", indent, "");
    if (!sk_CONF_VALUE_num(val)) {
      BIO_puts(out, "<EMPTY>\n");
    }
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(val); i++) {
    if (ml) {
      BIO_printf(out, "%*s", indent, "");
    } else if (i > 0) {
      BIO_printf(out, ", ");
    }
    const CONF_VALUE *nval = sk_CONF_VALUE_value(val, i);
    if (!nval->name) {
      BIO_puts(out, nval->value);
    } else if (!nval->value) {
      BIO_puts(out, nval->name);
    } else {
      BIO_printf(out, "%s:%s", nval->name, nval->value);
    }
    if (ml) {
      BIO_puts(out, "\n");
    }
  }
}